

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tar_filenames.c
# Opt level: O3

void test_tar_filenames(void)

{
  int iVar1;
  int iVar2;
  uint dlen;
  bool bVar3;
  
  iVar1 = 0x2d;
  do {
    iVar2 = 0x2d;
    do {
      test_filename((char *)0x0,iVar1,iVar2);
      test_filename("/",iVar1,iVar2);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x37);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x37);
  dlen = 0;
  do {
    iVar1 = 0x62;
    do {
      test_filename((char *)0x0,dlen,iVar1);
      test_filename("/",dlen,iVar1);
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0x66);
    bVar3 = dlen < 0x82;
    dlen = dlen + 10;
  } while (bVar3);
  iVar1 = 0x8c;
  do {
    iVar2 = 0x5f;
    do {
      test_filename((char *)0x0,iVar1,iVar2);
      test_filename("/",iVar1,iVar2);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x69);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0xa0);
  return;
}

Assistant:

DEFINE_TEST(test_tar_filenames)
{
	int dlen, flen;

	/* Repeat the following for a variety of dir/file lengths. */
	for (dlen = 45; dlen < 55; dlen++) {
		for (flen = 45; flen < 55; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}

	for (dlen = 0; dlen < 140; dlen += 10) {
		for (flen = 98; flen < 102; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}

	for (dlen = 140; dlen < 160; dlen++) {
		for (flen = 95; flen < 105; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}
}